

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void http_handle_static(nng_http *conn,void *data,nni_aio *aio)

{
  char *val;
  
  val = "application/octet-stream";
  if (*(char **)((long)data + 0x10) != (char *)0x0) {
    val = *(char **)((long)data + 0x10);
  }
  nni_http_set_header(conn,"Content-Type",val);
  nni_http_set_body(conn,*data,*(size_t *)((long)data + 8));
  nng_http_set_status(conn,NNG_HTTP_STATUS_OK,(char *)0x0);
  nni_aio_finish(aio,NNG_OK,0);
  return;
}

Assistant:

static void
http_handle_static(nng_http *conn, void *data, nni_aio *aio)
{
	http_static *hs = data;
	const char  *ctype;

	if ((ctype = hs->ctype) == NULL) {
		ctype = "application/octet-stream";
	}

	// this cannot fail (no dynamic allocation)
	(void) nni_http_set_header(conn, "Content-Type", ctype);
	nni_http_set_body(conn, hs->data, hs->size);

	nng_http_set_status(conn, NNG_HTTP_STATUS_OK, NULL);

	nni_aio_finish(aio, 0, 0);
}